

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_negation_range
                (array_container_t *src,int range_start,int range_end,container_t **dst)

{
  int size;
  array_container_t *paVar1;
  bitset_container_t *pbVar2;
  uint local_64;
  int local_60;
  int32_t val_in_range;
  int32_t in_pos;
  int32_t out_pos;
  array_container_t *arr;
  bitset_container_t *temp;
  int32_t new_cardinality;
  int32_t cardinality_change;
  int32_t new_values_in_range;
  int32_t span_to_be_flipped;
  int32_t current_values_in_range;
  int32_t last_index;
  int32_t start_index;
  container_t **dst_local;
  int range_end_local;
  int range_start_local;
  array_container_t *src_local;
  
  if (range_start < range_end) {
    current_values_in_range = binarySearch(src->array,src->cardinality,(uint16_t)range_start);
    if (current_values_in_range < 0) {
      current_values_in_range = -1 - current_values_in_range;
    }
    span_to_be_flipped = binarySearch(src->array,src->cardinality,(short)range_end - 1);
    if (span_to_be_flipped < 0) {
      span_to_be_flipped = -2 - span_to_be_flipped;
    }
    size = src->cardinality +
           (range_end - range_start) + ((span_to_be_flipped - current_values_in_range) + 1) * -2;
    if (size < 0x1001) {
      paVar1 = array_container_create_given_capacity(size);
      *dst = paVar1;
      if (size == 0) {
        paVar1->cardinality = 0;
        src_local._7_1_ = false;
      }
      else {
        memcpy(paVar1->array,src->array,(long)current_values_in_range << 1);
        val_in_range = current_values_in_range;
        local_60 = current_values_in_range;
        for (local_64 = range_start; (int)local_64 < range_end && local_60 <= span_to_be_flipped;
            local_64 = local_64 + 1) {
          if ((local_64 & 0xffff) == (uint)src->array[local_60]) {
            local_60 = local_60 + 1;
          }
          else {
            paVar1->array[val_in_range] = (uint16_t)local_64;
            val_in_range = val_in_range + 1;
          }
        }
        for (; (int)local_64 < range_end; local_64 = local_64 + 1) {
          paVar1->array[val_in_range] = (uint16_t)local_64;
          val_in_range = val_in_range + 1;
        }
        memcpy(paVar1->array + val_in_range,src->array + (span_to_be_flipped + 1),
               (long)(src->cardinality - (span_to_be_flipped + 1)) << 1);
        paVar1->cardinality = size;
        src_local._7_1_ = false;
      }
    }
    else {
      pbVar2 = bitset_container_from_array(src);
      bitset_flip_range(pbVar2->words,range_start,range_end);
      pbVar2->cardinality = size;
      *dst = pbVar2;
      src_local._7_1_ = true;
    }
  }
  else {
    paVar1 = array_container_clone(src);
    *dst = paVar1;
    src_local._7_1_ = false;
  }
  return src_local._7_1_;
}

Assistant:

bool array_container_negation_range(
    const array_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    /* close port of the Java implementation */
    if (range_start >= range_end) {
        *dst = array_container_clone(src);
        return false;
    }

    int32_t start_index =
        binarySearch(src->array, src->cardinality, (uint16_t)range_start);
    if (start_index < 0) start_index = -start_index - 1;

    int32_t last_index =
        binarySearch(src->array, src->cardinality, (uint16_t)(range_end - 1));
    if (last_index < 0) last_index = -last_index - 2;

    const int32_t current_values_in_range = last_index - start_index + 1;
    const int32_t span_to_be_flipped = range_end - range_start;
    const int32_t new_values_in_range =
        span_to_be_flipped - current_values_in_range;
    const int32_t cardinality_change =
        new_values_in_range - current_values_in_range;
    const int32_t new_cardinality = src->cardinality + cardinality_change;

    if (new_cardinality > DEFAULT_MAX_SIZE) {
        bitset_container_t *temp = bitset_container_from_array(src);
        bitset_flip_range(temp->words, (uint32_t)range_start,
                          (uint32_t)range_end);
        temp->cardinality = new_cardinality;
        *dst = temp;
        return true;
    }

    array_container_t *arr =
        array_container_create_given_capacity(new_cardinality);
    *dst = (container_t *)arr;
    if(new_cardinality == 0) {
      arr->cardinality = new_cardinality;
      return false; // we are done.
    }
    // copy stuff before the active area
    memcpy(arr->array, src->array, start_index * sizeof(uint16_t));

    // work on the range
    int32_t out_pos = start_index, in_pos = start_index;
    int32_t val_in_range = range_start;
    for (; val_in_range < range_end && in_pos <= last_index; ++val_in_range) {
        if ((uint16_t)val_in_range != src->array[in_pos]) {
            arr->array[out_pos++] = (uint16_t)val_in_range;
        } else {
            ++in_pos;
        }
    }
    for (; val_in_range < range_end; ++val_in_range)
        arr->array[out_pos++] = (uint16_t)val_in_range;

    // content after the active range
    memcpy(arr->array + out_pos, src->array + (last_index + 1),
           (src->cardinality - (last_index + 1)) * sizeof(uint16_t));
    arr->cardinality = new_cardinality;
    return false;
}